

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O3

void p_tree_insert(PTree *tree,ppointer key,ppointer value)

{
  pboolean pVar1;
  
  if ((tree != (PTree *)0x0) &&
     (pVar1 = (*tree->insert_node_func)
                        (&tree->root,tree->compare_func,tree->data,tree->key_destroy_func,
                         tree->value_destroy_func,key,value), pVar1 == 1)) {
    tree->nnodes = tree->nnodes + 1;
  }
  return;
}

Assistant:

P_LIB_API void
p_tree_insert (PTree	*tree,
	       ppointer	key,
	       ppointer	value)
{
	pboolean result;

	if (P_UNLIKELY (tree == NULL))
		return;

	result = tree->insert_node_func (&tree->root,
					 tree->compare_func,
					 tree->data,
					 tree->key_destroy_func,
					 tree->value_destroy_func,
					 key,
					 value);

	if (result == TRUE)
		++tree->nnodes;
}